

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.c
# Opt level: O1

int loader_initialize_host(char *tag)

{
  int iVar1;
  plugin p;
  loader_impl impl;
  undefined8 *puVar2;
  int iVar3;
  
  p = (plugin)plugin_manager_get(&loader_manager,tag);
  iVar3 = 1;
  if (p != (plugin)0x0) {
    impl = (loader_impl)plugin_impl(p);
    iVar1 = loader_impl_initialize(&loader_manager,p,impl);
    if (iVar1 == 0) {
      puVar2 = (undefined8 *)plugin_manager_impl(&loader_manager);
      *puVar2 = p;
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int loader_initialize_host(const loader_tag tag)
{
	plugin p = plugin_manager_get(&loader_manager, tag);

	if (p == NULL)
	{
		return 1;
	}

	if (loader_impl_initialize(&loader_manager, p, plugin_impl_type(p, loader_impl)) != 0)
	{
		return 1;
	}
	else
	{
		loader_manager_impl manager_impl = plugin_manager_impl_type(&loader_manager, loader_manager_impl);

		manager_impl->host = p;

		return 0;
	}
}